

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O0

void __thiscall
pstore::
error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
::
copy_construct<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
           *this,error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                 *rhs)

{
  error_code *peVar1;
  storage_type *psVar2;
  storage_type *psVar3;
  error_code eVar4;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  *rhs_local;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  *this_local;
  
  this[0x10] = (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                )(rhs->has_error_ & 1);
  if (((byte)this[0x10] & 1) == 0) {
    psVar2 = error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
             ::get_storage((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                            *)this);
    psVar3 = error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
             ::get_storage(rhs);
    psVar2->_M_data = psVar3->_M_data;
  }
  else {
    peVar1 = error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
             ::get_error_storage((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                                  *)this);
    eVar4 = error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
            ::get_error(rhs);
    peVar1->_M_value = eVar4._M_value;
    peVar1->_M_cat = eVar4._M_cat;
  }
  return;
}

Assistant:

void error_or<T>::copy_construct (error_or<Other> const & rhs) {
        has_error_ = rhs.has_error_;
        if (has_error_) {
            new (get_error_storage ()) std::error_code (rhs.get_error ());
        } else {
            new (get_storage ()) storage_type (*rhs.get_storage ());
        }
    }